

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer *
Serialize<TObjPtr<AActor>,TObjPtr<AActor>>
          (FSerializer *arc,char *key,TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *value,
          TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *param_4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  TObjPtr<AActor> *value_00;
  uint local_38;
  uint i;
  bool res;
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *param_3_local;
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if ((!bVar1) || (uVar3 = TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Size(value), uVar3 != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    bVar2 = FSerializer::isReading(arc);
    if (bVar2) {
      if (!bVar1) {
        TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Clear(value);
        return arc;
      }
      uVar3 = FSerializer::ArraySize(arc);
      TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Resize(value,uVar3);
    }
    for (local_38 = 0; uVar3 = TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Size(value),
        local_38 < uVar3; local_38 = local_38 + 1) {
      value_00 = TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::operator[](value,(ulong)local_38);
      Serialize<AActor>(arc,(char *)0x0,value_00,(TObjPtr<AActor> *)0x0);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}